

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O1

uint __thiscall llvm::StringMapImpl::LookupBucketFor(StringMapImpl *this,StringRef Name)

{
  StringMapEntryBase **ppSVar1;
  StringMapEntryBase *pSVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  size_t unaff_RBX;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  
  sVar7 = Name.Length;
  uVar8 = this->NumBuckets;
  if (uVar8 == 0) {
    init(this,(EVP_PKEY_CTX *)0x10);
    uVar8 = this->NumBuckets;
    unaff_RBX = sVar7;
  }
  if (sVar7 == 0) {
    uVar12 = 0;
  }
  else {
    sVar5 = 0;
    uVar12 = 0;
    do {
      uVar12 = uVar12 * 0x21 + (uint)(byte)Name.Data[sVar5];
      sVar5 = sVar5 + 1;
    } while (sVar7 != sVar5);
  }
  uVar10 = uVar12 & uVar8 - 1;
  ppSVar1 = this->TheTable;
  lVar3 = (ulong)this->NumBuckets * 8 + 8;
  iVar9 = 1;
  uVar11 = 0xffffffff;
  do {
    uVar6 = (ulong)uVar10;
    pSVar2 = ppSVar1[uVar6];
    if (pSVar2 == (StringMapEntryBase *)0x0) {
      if (uVar11 == 0xffffffff) {
        *(uint *)((long)ppSVar1 + uVar6 * 4 + lVar3) = uVar12;
        uVar11 = 0xffffffff;
        bVar13 = false;
        unaff_RBX = (size_t)uVar10;
      }
      else {
        *(uint *)((long)ppSVar1 + (long)(int)uVar11 * 4 + lVar3) = uVar12;
        bVar13 = false;
        unaff_RBX = (size_t)uVar11;
      }
    }
    else {
      if (pSVar2 == (StringMapEntryBase *)0xfffffffffffffff8) {
        if (uVar11 == 0xffffffff) {
          uVar11 = uVar10;
        }
      }
      else if (*(uint *)((long)ppSVar1 + uVar6 * 4 + lVar3) == uVar12) {
        sVar5 = pSVar2->StrLen;
        if (sVar5 == sVar7) {
          if (sVar5 == 0) {
            bVar13 = true;
          }
          else {
            iVar4 = bcmp(Name.Data,(void *)((long)&pSVar2->StrLen + (ulong)this->ItemSize),sVar5);
            bVar13 = iVar4 == 0;
          }
        }
        else {
          bVar13 = false;
        }
        unaff_RBX = unaff_RBX & 0xffffffff;
        if (bVar13) {
          unaff_RBX = (size_t)uVar10;
          bVar13 = false;
          goto LAB_00db976d;
        }
      }
      uVar10 = uVar10 + iVar9 & uVar8 - 1;
      iVar9 = iVar9 + 1;
      bVar13 = true;
    }
LAB_00db976d:
    if (!bVar13) {
      return (uint)unaff_RBX;
    }
  } while( true );
}

Assistant:

unsigned StringMapImpl::LookupBucketFor(StringRef Name) {
  unsigned HTSize = NumBuckets;
  if (HTSize == 0) {  // Hash table unallocated so far?
    init(16);
    HTSize = NumBuckets;
  }
  unsigned FullHashValue = djbHash(Name, 0);
  unsigned BucketNo = FullHashValue & (HTSize-1);
  unsigned *HashTable = (unsigned *)(TheTable + NumBuckets + 1);

  unsigned ProbeAmt = 1;
  int FirstTombstone = -1;
  while (true) {
    StringMapEntryBase *BucketItem = TheTable[BucketNo];
    // If we found an empty bucket, this key isn't in the table yet, return it.
    if (LLVM_LIKELY(!BucketItem)) {
      // If we found a tombstone, we want to reuse the tombstone instead of an
      // empty bucket.  This reduces probing.
      if (FirstTombstone != -1) {
        HashTable[FirstTombstone] = FullHashValue;
        return FirstTombstone;
      }

      HashTable[BucketNo] = FullHashValue;
      return BucketNo;
    }

    if (BucketItem == getTombstoneVal()) {
      // Skip over tombstones.  However, remember the first one we see.
      if (FirstTombstone == -1) FirstTombstone = BucketNo;
    } else if (LLVM_LIKELY(HashTable[BucketNo] == FullHashValue)) {
      // If the full hash value matches, check deeply for a match.  The common
      // case here is that we are only looking at the buckets (for item info
      // being non-null and for the full hash value) not at the items.  This
      // is important for cache locality.

      // Do the comparison like this because Name isn't necessarily
      // null-terminated!
      char *ItemStr = (char*)BucketItem+ItemSize;
      if (Name == StringRef(ItemStr, BucketItem->getKeyLength())) {
        // We found a match!
        return BucketNo;
      }
    }

    // Okay, we didn't find the item.  Probe to the next bucket.
    BucketNo = (BucketNo+ProbeAmt) & (HTSize-1);

    // Use quadratic probing, it has fewer clumping artifacts than linear
    // probing and has good cache behavior in the common case.
    ++ProbeAmt;
  }
}